

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ipc.c
# Opt level: O3

void ipc_pipe_fini(void *arg)

{
  ipc_pipe_stop(arg);
  nng_stream_free(*arg);
  nni_aio_fini((nni_aio *)((long)arg + 0x270));
  nni_aio_fini((nni_aio *)((long)arg + 0xa8));
  nni_aio_fini((nni_aio *)((long)arg + 0x438));
  nni_msg_free(*(nni_msg **)((long)arg + 0x600));
  nni_mtx_fini((nni_mtx *)((long)arg + 0x608));
  return;
}

Assistant:

static void
ipc_pipe_fini(void *arg)
{
	ipc_pipe *p = arg;

	ipc_pipe_stop(p);
	nng_stream_free(p->conn);
	nni_aio_fini(&p->rx_aio);
	nni_aio_fini(&p->tx_aio);
	nni_aio_fini(&p->neg_aio);
	nni_msg_free(p->rx_msg);
	nni_mtx_fini(&p->mtx);
}